

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

StringMeasure * __thiscall MixedArena::alloc<wasm::StringMeasure>(MixedArena *this)

{
  StringMeasure *pSVar1;
  
  pSVar1 = (StringMeasure *)allocSpace(this,0x20,8);
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)75>).super_Expression._id =
       StringMeasureId;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)75>).super_Expression.type.id = 0;
  return pSVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }